

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_JP2K.cpp
# Opt level: O0

ostream * ASDCP::JP2K::operator<<(ostream *strm,PictureDescriptor *PDesc)

{
  unsigned_short i_00;
  ui16_t uVar1;
  _Setw _Var2;
  ostream *poVar3;
  void *pvVar4;
  char *pcVar5;
  int local_244;
  int local_240;
  i32_t i_3;
  i32_t b;
  ui16_t i_2;
  ui16_t i_1;
  char tmp_buf [512];
  uint local_2c;
  ui32_t precinct_set_size;
  uint local_1c;
  ui32_t i;
  PictureDescriptor *PDesc_local;
  ostream *strm_local;
  
  poVar3 = std::operator<<(strm,"       AspectRatio: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(PDesc->AspectRatio).Numerator);
  poVar3 = std::operator<<(poVar3,"/");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,(PDesc->AspectRatio).Denominator);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(strm,"          EditRate: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(PDesc->EditRate).Numerator);
  poVar3 = std::operator<<(poVar3,"/");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,(PDesc->EditRate).Denominator);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(strm,"        SampleRate: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(PDesc->SampleRate).Numerator);
  poVar3 = std::operator<<(poVar3,"/");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,(PDesc->SampleRate).Denominator);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(strm,"       StoredWidth: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,PDesc->StoredWidth);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(strm,"      StoredHeight: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,PDesc->StoredHeight);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(strm,"             Rsize: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,(uint)PDesc->Rsize);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(strm,"             Xsize: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,PDesc->Xsize);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(strm,"             Ysize: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,PDesc->Ysize);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(strm,"            XOsize: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,PDesc->XOsize);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(strm,"            YOsize: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,PDesc->YOsize);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(strm,"            XTsize: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,PDesc->XTsize);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(strm,"            YTsize: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,PDesc->YTsize);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(strm,"           XTOsize: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,PDesc->XTOsize);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(strm,"           YTOsize: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,PDesc->YTOsize);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(strm," ContainerDuration: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,PDesc->ContainerDuration);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(strm,"-- JPEG 2000 Metadata --");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(strm,"    ImageComponents:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(strm,"  bits  h-sep v-sep");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  for (local_1c = 0; local_1c < PDesc->Csize && local_1c < 3; local_1c = local_1c + 1) {
    poVar3 = std::operator<<(strm,"  ");
    _Var2 = std::setw(4);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,PDesc->ImageComponents[local_1c].Ssize + 1);
    poVar3 = std::operator<<(poVar3,"  ");
    _Var2 = std::setw(5);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = std::operator<<(poVar3,PDesc->ImageComponents[local_1c].XRsize);
    poVar3 = std::operator<<(poVar3," ");
    _Var2 = std::setw(5);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = std::operator<<(poVar3,PDesc->ImageComponents[local_1c].YRsize);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  poVar3 = std::operator<<(strm,"               Scod: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,(ushort)(PDesc->CodingStyleDefault).Scod);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(strm,"   ProgressionOrder: ");
  pvVar4 = (void *)std::ostream::operator<<
                             (poVar3,(ushort)(PDesc->CodingStyleDefault).SGcod.ProgressionOrder);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(strm,"     NumberOfLayers: ");
  i_00 = Kumu::cp2i<unsigned_short>((PDesc->CodingStyleDefault).SGcod.NumberOfLayers);
  uVar1 = Kumu::Swap2(i_00);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,uVar1);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(strm," MultiCompTransform: ");
  pvVar4 = (void *)std::ostream::operator<<
                             (poVar3,(ushort)(PDesc->CodingStyleDefault).SGcod.MultiCompTransform);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(strm,"DecompositionLevels: ");
  pvVar4 = (void *)std::ostream::operator<<
                             (poVar3,(ushort)(PDesc->CodingStyleDefault).SPcod.DecompositionLevels);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(strm,"     CodeblockWidth: ");
  pvVar4 = (void *)std::ostream::operator<<
                             (poVar3,(ushort)(PDesc->CodingStyleDefault).SPcod.CodeblockWidth);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(strm,"    CodeblockHeight: ");
  pvVar4 = (void *)std::ostream::operator<<
                             (poVar3,(ushort)(PDesc->CodingStyleDefault).SPcod.CodeblockHeight);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(strm,"     CodeblockStyle: ");
  pvVar4 = (void *)std::ostream::operator<<
                             (poVar3,(ushort)(PDesc->CodingStyleDefault).SPcod.CodeblockStyle);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(strm,"     Transformation: ");
  pvVar4 = (void *)std::ostream::operator<<
                             (poVar3,(ushort)(PDesc->CodingStyleDefault).SPcod.Transformation);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  local_2c = 0;
  for (local_1c = 0;
      (PDesc->CodingStyleDefault).SPcod.PrecinctSize[local_1c] != '\0' && local_1c < 0x20;
      local_1c = local_1c + 1) {
    local_2c = local_2c + 1;
  }
  poVar3 = std::operator<<(strm,"          Precincts: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,(short)local_2c);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(strm,"precinct dimensions:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  for (local_1c = 0; local_1c < local_2c && local_1c < 0x20; local_1c = local_1c + 1) {
    poVar3 = std::operator<<(strm,"    ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c + 1);
    poVar3 = std::operator<<(poVar3,": ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,s_exp_lookup
                               [(int)((PDesc->CodingStyleDefault).SPcod.PrecinctSize[local_1c] & 0xf
                                     )]);
    poVar3 = std::operator<<(poVar3," x ");
    pvVar4 = (void *)std::ostream::operator<<
                               (poVar3,s_exp_lookup
                                       [(int)(uint)(PDesc->CodingStyleDefault).SPcod.PrecinctSize
                                                   [local_1c] >> 4]);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  }
  poVar3 = std::operator<<(strm,"               Sqcd: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,(ushort)(PDesc->QuantizationDefault).Sqcd);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(strm,"              SPqcd: ");
  pcVar5 = (char *)Kumu::bin2hex((PDesc->QuantizationDefault).SPqcd,
                                 (uint)(PDesc->QuantizationDefault).SPqcdLength,(char *)&b,0x200);
  poVar3 = std::operator<<(poVar3,pcVar5);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  if ((PDesc->Profile).N != 0) {
    poVar3 = std::operator<<(strm,"Profile:");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    for (i_3._2_2_ = 0; i_3._2_2_ < (PDesc->Profile).N; i_3._2_2_ = i_3._2_2_ + 1) {
      poVar3 = std::operator<<(strm,"              Pprf(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,i_3._2_2_ + 1);
      poVar3 = std::operator<<(poVar3,"): ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
      pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::showbase);
      pvVar4 = (void *)std::ostream::operator<<(pvVar4,(PDesc->Profile).Pprf[i_3._2_2_]);
      pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::dec);
      pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::noshowbase);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    }
  }
  if ((PDesc->CorrespondingProfile).N != 0) {
    poVar3 = std::operator<<(strm,"Corresponding Profile:");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    for (i_3._0_2_ = 0; (ushort)i_3 < (PDesc->CorrespondingProfile).N; i_3._0_2_ = (ushort)i_3 + 1)
    {
      poVar3 = std::operator<<(strm,"              Pcpf(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)i_3 + 1);
      poVar3 = std::operator<<(poVar3,"): ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
      pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::showbase);
      pvVar4 = (void *)std::ostream::operator<<
                                 (pvVar4,(PDesc->CorrespondingProfile).Pcpf[(ushort)i_3]);
      pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::dec);
      pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::noshowbase);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    }
  }
  if (((PDesc->ExtendedCapabilities).N != -1) && ((PDesc->ExtendedCapabilities).Pcap != 0)) {
    poVar3 = std::operator<<(strm,"Extended Capabilities:");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(strm,"                     Pcap:");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,(PDesc->ExtendedCapabilities).Pcap);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    local_244 = 0;
    for (local_240 = 0; local_240 < 0x20; local_240 = local_240 + 1) {
      if (((PDesc->ExtendedCapabilities).Pcap >> ((byte)local_240 & 0x1f) & 1) != 0) {
        poVar3 = std::operator<<(strm,"              Ccap(");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x20 - local_240);
        poVar3 = std::operator<<(poVar3,"): ");
        pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
        pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::showbase);
        pvVar4 = (void *)std::ostream::operator<<
                                   (pvVar4,(PDesc->ExtendedCapabilities).Ccap[local_244]);
        pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::dec);
        pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::noshowbase);
        std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
        local_244 = local_244 + 1;
      }
    }
  }
  return strm;
}

Assistant:

std::ostream&
ASDCP::JP2K::operator << (std::ostream& strm, const PictureDescriptor& PDesc)
{
  strm << "       AspectRatio: " << PDesc.AspectRatio.Numerator << "/" << PDesc.AspectRatio.Denominator << std::endl;
  strm << "          EditRate: " << PDesc.EditRate.Numerator << "/" << PDesc.EditRate.Denominator << std::endl;
  strm << "        SampleRate: " << PDesc.SampleRate.Numerator << "/" << PDesc.SampleRate.Denominator << std::endl;
  strm << "       StoredWidth: " << (unsigned) PDesc.StoredWidth << std::endl;
  strm << "      StoredHeight: " << (unsigned) PDesc.StoredHeight << std::endl;
  strm << "             Rsize: " << (unsigned) PDesc.Rsize << std::endl;
  strm << "             Xsize: " << (unsigned) PDesc.Xsize << std::endl;
  strm << "             Ysize: " << (unsigned) PDesc.Ysize << std::endl;
  strm << "            XOsize: " << (unsigned) PDesc.XOsize << std::endl;
  strm << "            YOsize: " << (unsigned) PDesc.YOsize << std::endl;
  strm << "            XTsize: " << (unsigned) PDesc.XTsize << std::endl;
  strm << "            YTsize: " << (unsigned) PDesc.YTsize << std::endl;
  strm << "           XTOsize: " << (unsigned) PDesc.XTOsize << std::endl;
  strm << "           YTOsize: " << (unsigned) PDesc.YTOsize << std::endl;
  strm << " ContainerDuration: " << (unsigned) PDesc.ContainerDuration << std::endl;

  strm << "-- JPEG 2000 Metadata --" << std::endl;
  strm << "    ImageComponents:" << std::endl;
  strm << "  bits  h-sep v-sep" << std::endl;

  ui32_t i;
  for ( i = 0; i < PDesc.Csize && i < MaxComponents; ++i )
    {
      strm << "  " << std::setw(4) << PDesc.ImageComponents[i].Ssize + 1 /* See ISO 15444-1, Table A11, for the origin of '+1' */
	   << "  " << std::setw(5) << PDesc.ImageComponents[i].XRsize
	   << " " << std::setw(5) << PDesc.ImageComponents[i].YRsize
	   << std::endl;
    }

  strm << "               Scod: " << (short) PDesc.CodingStyleDefault.Scod << std::endl;
  strm << "   ProgressionOrder: " << (short) PDesc.CodingStyleDefault.SGcod.ProgressionOrder << std::endl;
  strm << "     NumberOfLayers: " << (short) KM_i16_BE(Kumu::cp2i<ui16_t>(PDesc.CodingStyleDefault.SGcod.NumberOfLayers)) << std::endl;
  strm << " MultiCompTransform: " << (short) PDesc.CodingStyleDefault.SGcod.MultiCompTransform << std::endl;
  strm << "DecompositionLevels: " << (short) PDesc.CodingStyleDefault.SPcod.DecompositionLevels << std::endl;
  strm << "     CodeblockWidth: " << (short) PDesc.CodingStyleDefault.SPcod.CodeblockWidth << std::endl;
  strm << "    CodeblockHeight: " << (short) PDesc.CodingStyleDefault.SPcod.CodeblockHeight << std::endl;
  strm << "     CodeblockStyle: " << (short) PDesc.CodingStyleDefault.SPcod.CodeblockStyle << std::endl;
  strm << "     Transformation: " << (short) PDesc.CodingStyleDefault.SPcod.Transformation << std::endl;


  ui32_t precinct_set_size = 0;

  for ( i = 0; PDesc.CodingStyleDefault.SPcod.PrecinctSize[i] != 0 && i < MaxPrecincts; ++i )
    precinct_set_size++;

  strm << "          Precincts: " << (short) precinct_set_size << std::endl;
  strm << "precinct dimensions:" << std::endl;

  for ( i = 0; i < precinct_set_size && i < MaxPrecincts; ++i )
    strm << "    " << i + 1 << ": " << s_exp_lookup[PDesc.CodingStyleDefault.SPcod.PrecinctSize[i]&0x0f] << " x "
	 << s_exp_lookup[(PDesc.CodingStyleDefault.SPcod.PrecinctSize[i]>>4)&0x0f] << std::endl;

  strm << "               Sqcd: " << (short) PDesc.QuantizationDefault.Sqcd << std::endl;

  char tmp_buf[MaxDefaults*2];
  strm << "              SPqcd: " << Kumu::bin2hex(PDesc.QuantizationDefault.SPqcd, PDesc.QuantizationDefault.SPqcdLength, tmp_buf, MaxDefaults*2)
       << std::endl;

  if (PDesc.Profile.N != 0) {
	  strm << "Profile:" << std::endl;

	  for (ui16_t i = 0; i < PDesc.Profile.N; i++) {
		  strm << "              Pprf(" << (i + 1) << "): "
			  << std::hex << std::showbase << PDesc.Profile.Pprf[i] << std::dec << std::noshowbase
			  << std::endl;
	  }
  }

  if (PDesc.CorrespondingProfile.N != 0) {
	  strm << "Corresponding Profile:" << std::endl;

	  for (ui16_t i = 0; i < PDesc.CorrespondingProfile.N; i++) {

		  strm << "              Pcpf(" << (i + 1) << "): "
			  << std::hex << std::showbase <<  PDesc.CorrespondingProfile.Pcpf[i] << std::dec << std::noshowbase
			  << std::endl;
	  }
  }

  if (PDesc.ExtendedCapabilities.N != JP2K::NoExtendedCapabilitiesSignaled && PDesc.ExtendedCapabilities.Pcap != 0) {

	  strm << "Extended Capabilities:" << std::endl;


	  strm << "                     Pcap:" << PDesc.ExtendedCapabilities.Pcap << std::endl;

	  for (i32_t b = 0, i = 0; b < JP2K::MaxCapabilities; b++) {

		  if ((PDesc.ExtendedCapabilities.Pcap >> b) & 0x1) {

			  strm << "              Ccap(" << (JP2K::MaxCapabilities - b) << "): " <<
				  std::hex << std::showbase << PDesc.ExtendedCapabilities.Ccap[i++] << std::dec << std::noshowbase
				  << std::endl;

		  }
	  }
  }

  return strm;
}